

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *pInLimit;
  long *plVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  BYTE *pBVar10;
  undefined8 uVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  long *plVar15;
  size_t sVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long *plVar22;
  uint uVar23;
  long *plVar24;
  long *plVar25;
  seqDef *psVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  long *plVar32;
  long *plVar33;
  BYTE *litEnd;
  U32 UVar34;
  uint uVar35;
  uint local_b4;
  BYTE *base;
  U32 *hashLong;
  BYTE *litLimit_w_3;
  U32 *hashSmall;
  BYTE *litLimit_w;
  BYTE *ilimit;
  
  pBVar7 = (ms->window).base;
  pInLimit = (long *)((long)src + srcSize);
  iVar31 = (int)pBVar7;
  iVar30 = (int)pInLimit - iVar31;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar4 = (ms->window).dictLimit;
  uVar14 = iVar30 - uVar13;
  if (iVar30 - uVar4 <= uVar13) {
    uVar14 = uVar4;
  }
  plVar1 = (long *)(pBVar7 + uVar14);
  uVar4 = *rep;
  uVar13 = rep[1];
  plVar33 = (long *)((ulong)((int)src == (int)plVar1) + (long)src);
  uVar23 = (int)plVar33 - (int)plVar1;
  local_b4 = uVar13;
  if (uVar23 < uVar13) {
    local_b4 = 0;
  }
  uVar35 = 0;
  if (uVar4 <= uVar23) {
    uVar35 = uVar4;
  }
  bVar18 = 0x40 - (char)(ms->cParams).hashLog;
  uVar5 = (ms->cParams).minMatch;
  pUVar8 = ms->hashTable;
  pUVar9 = ms->chainTable;
  plVar32 = (long *)((long)src + (srcSize - 8));
  cVar12 = (char)(ms->cParams).chainLog;
  if (uVar5 == 5) {
    bVar19 = 0x40 - cVar12;
    plVar15 = pInLimit + -4;
    uVar21 = (ulong)uVar35;
LAB_0010f63f:
    uVar35 = (uint)uVar21;
    while( true ) {
      if (plVar32 <= plVar33) goto LAB_00110502;
      lVar17 = *plVar33;
      uVar27 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar29 = (ulong)(lVar17 * -0x30e4432345000000) >> (bVar19 & 0x3f);
      UVar34 = (int)plVar33 - iVar31;
      uVar5 = pUVar8[uVar27];
      uVar6 = pUVar9[uVar29];
      pUVar9[uVar29] = UVar34;
      pUVar8[uVar27] = UVar34;
      plVar22 = (long *)((long)plVar33 + 1);
      if ((uVar35 != 0) && (*(int *)((long)plVar33 + -uVar21 + 1) == *(int *)((long)plVar33 + 1)))
      break;
      if ((uVar14 < uVar5) && (plVar24 = (long *)(pBVar7 + uVar5), *plVar24 == lVar17)) {
        sVar16 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar24 + 1),(BYTE *)pInLimit);
        lVar17 = sVar16 + 8;
        uVar21 = (long)plVar33 - (long)plVar24;
        for (plVar22 = plVar33;
            ((plVar1 < plVar24 && (src < plVar22)) &&
            (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
            plVar22 = (long *)((long)plVar22 + -1)) {
          plVar24 = (long *)((long)plVar24 + -1);
          lVar17 = lVar17 + 1;
        }
        goto LAB_0010f94d;
      }
      if ((uVar14 < uVar6) && (plVar24 = (long *)(pBVar7 + uVar6), (int)*plVar24 == (int)*plVar33))
      goto LAB_0010f877;
      plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    }
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -uVar21 + 5),
                        (BYTE *)pInLimit);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_00110571;
    if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
    uVar27 = (long)plVar22 - (long)src;
    plVar33 = (long *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27))
    goto LAB_00110590;
    if (pInLimit < plVar22) goto LAB_001105af;
    if (plVar15 < plVar22) {
      ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
      goto LAB_0010f793;
    }
    lVar17 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar17;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0010fa6a;
    }
    lVar17 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar17 < 8) {
      if (-0x10 < lVar17) goto LAB_0011060c;
    }
    else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0011062b;
    lVar17 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar17;
    if (0x20 < (long)uVar27) {
      lVar17 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar17 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar17 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar17 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar17 = lVar17 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
LAB_0010f793:
    seqStore->lit = seqStore->lit + uVar27;
    if (0xffff < uVar27) {
      if (seqStore->longLengthID != 0) goto LAB_001105ed;
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
LAB_0010fa6a:
    lVar17 = sVar16 + 4;
    uVar29 = sVar16 + 1;
    psVar26 = seqStore->sequences;
    psVar26->litLength = (U16)uVar27;
    psVar26->offset = 1;
    if (uVar29 < 0x10000) goto LAB_0010faed;
    if (seqStore->longLengthID == 0) goto LAB_0010face;
    goto LAB_001105ce;
  }
  if (uVar5 == 6) {
    bVar19 = 0x40 - cVar12;
    plVar15 = pInLimit + -4;
    uVar21 = (ulong)uVar35;
LAB_0010eecc:
    uVar35 = (uint)uVar21;
    while( true ) {
      if (plVar32 <= plVar33) goto LAB_00110502;
      lVar17 = *plVar33;
      uVar27 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar29 = (ulong)(lVar17 * -0x30e4432340650000) >> (bVar19 & 0x3f);
      UVar34 = (int)plVar33 - iVar31;
      uVar5 = pUVar8[uVar27];
      uVar6 = pUVar9[uVar29];
      pUVar9[uVar29] = UVar34;
      pUVar8[uVar27] = UVar34;
      plVar22 = (long *)((long)plVar33 + 1);
      if ((uVar35 != 0) && (*(int *)((long)plVar33 + -uVar21 + 1) == *(int *)((long)plVar33 + 1)))
      break;
      if ((uVar14 < uVar5) && (plVar24 = (long *)(pBVar7 + uVar5), *plVar24 == lVar17)) {
        sVar16 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar24 + 1),(BYTE *)pInLimit);
        lVar17 = sVar16 + 8;
        uVar21 = (long)plVar33 - (long)plVar24;
        for (plVar22 = plVar33;
            ((plVar1 < plVar24 && (src < plVar22)) &&
            (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
            plVar22 = (long *)((long)plVar22 + -1)) {
          plVar24 = (long *)((long)plVar24 + -1);
          lVar17 = lVar17 + 1;
        }
        goto LAB_0010f1d1;
      }
      if ((uVar14 < uVar6) && (plVar24 = (long *)(pBVar7 + uVar6), (int)*plVar24 == (int)*plVar33))
      goto LAB_0010f0fb;
      plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    }
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -uVar21 + 5),
                        (BYTE *)pInLimit);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_00110571;
    if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
    uVar27 = (long)plVar22 - (long)src;
    plVar33 = (long *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27))
    goto LAB_00110590;
    if (pInLimit < plVar22) goto LAB_001105af;
    if (plVar15 < plVar22) {
      ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
      goto LAB_0010f017;
    }
    lVar17 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar17;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0010f2ee;
    }
    lVar17 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar17 < 8) {
      if (-0x10 < lVar17) goto LAB_0011060c;
    }
    else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0011062b;
    lVar17 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar17;
    if (0x20 < (long)uVar27) {
      lVar17 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar17 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar17 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar17 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar17 = lVar17 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
LAB_0010f017:
    seqStore->lit = seqStore->lit + uVar27;
    if (0xffff < uVar27) {
      if (seqStore->longLengthID != 0) goto LAB_001105ed;
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
LAB_0010f2ee:
    lVar17 = sVar16 + 4;
    uVar29 = sVar16 + 1;
    psVar26 = seqStore->sequences;
    psVar26->litLength = (U16)uVar27;
    psVar26->offset = 1;
    if (uVar29 < 0x10000) goto LAB_0010f371;
    if (seqStore->longLengthID == 0) goto LAB_0010f352;
    goto LAB_001105ce;
  }
  if (uVar5 != 7) {
    bVar19 = 0x20 - cVar12;
    plVar15 = pInLimit + -4;
    uVar21 = (ulong)uVar35;
LAB_0010fdb2:
    uVar35 = (uint)uVar21;
    while( true ) {
      if (plVar32 <= plVar33) goto LAB_00110502;
      uVar27 = (ulong)(*plVar33 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar20 = (uint)((int)*plVar33 * -0x61c8864f) >> (bVar19 & 0x1f);
      UVar34 = (int)plVar33 - iVar31;
      uVar5 = pUVar8[uVar27];
      uVar6 = pUVar9[uVar20];
      plVar22 = (long *)((long)plVar33 + 1);
      pUVar9[uVar20] = UVar34;
      pUVar8[uVar27] = UVar34;
      if ((uVar35 != 0) && (*(int *)((long)plVar33 + -uVar21 + 1) == *(int *)((long)plVar33 + 1)))
      break;
      if ((uVar14 < uVar5) && (plVar24 = (long *)(pBVar7 + uVar5), *plVar24 == *plVar33)) {
        sVar16 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar24 + 1),(BYTE *)pInLimit);
        lVar17 = sVar16 + 8;
        uVar21 = (long)plVar33 - (long)plVar24;
        for (plVar22 = plVar33;
            ((plVar1 < plVar24 && (src < plVar22)) &&
            (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
            plVar22 = (long *)((long)plVar22 + -1)) {
          plVar24 = (long *)((long)plVar24 + -1);
          lVar17 = lVar17 + 1;
        }
        goto LAB_001100b2;
      }
      if ((uVar14 < uVar6) && (plVar24 = (long *)(pBVar7 + uVar6), (int)*plVar24 == (int)*plVar33))
      goto LAB_0010ffd9;
      plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    }
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -uVar21 + 5),
                        (BYTE *)pInLimit);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_00110571;
    if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
    uVar27 = (long)plVar22 - (long)src;
    plVar33 = (long *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27))
    goto LAB_00110590;
    if (pInLimit < plVar22) goto LAB_001105af;
    if (plVar15 < plVar22) {
      ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
      goto LAB_0010fef5;
    }
    lVar17 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar17;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_001101ce;
    }
    lVar17 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar17 < 8) {
      if (-0x10 < lVar17) goto LAB_0011060c;
    }
    else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0011062b;
    lVar17 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar17;
    if (0x20 < (long)uVar27) {
      lVar17 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar17 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar17 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar17 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar17 = lVar17 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
LAB_0010fef5:
    seqStore->lit = seqStore->lit + uVar27;
    if (0xffff < uVar27) {
      if (seqStore->longLengthID != 0) goto LAB_001105ed;
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
LAB_001101ce:
    lVar17 = sVar16 + 4;
    uVar29 = sVar16 + 1;
    psVar26 = seqStore->sequences;
    psVar26->litLength = (U16)uVar27;
    psVar26->offset = 1;
    if (uVar29 < 0x10000) goto LAB_00110254;
    if (seqStore->longLengthID == 0) goto LAB_00110235;
    goto LAB_001105ce;
  }
  bVar19 = 0x40 - cVar12;
  plVar15 = pInLimit + -4;
  uVar21 = (ulong)uVar35;
LAB_0010e744:
  uVar35 = (uint)uVar21;
LAB_0010e74a:
  if (plVar32 <= plVar33) {
LAB_00110502:
    uVar14 = 0;
    if (uVar23 < uVar13) {
      uVar14 = uVar13;
    }
    if (uVar23 < uVar4) {
      uVar14 = uVar4;
    }
    if (uVar35 == 0) {
      uVar35 = uVar14;
    }
    if (local_b4 != 0) {
      uVar14 = local_b4;
    }
    *rep = uVar35;
    rep[1] = uVar14;
    return (long)pInLimit - (long)src;
  }
  lVar17 = *plVar33;
  uVar27 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
  uVar29 = (ulong)(lVar17 * -0x30e44323405a9d00) >> (bVar19 & 0x3f);
  UVar34 = (int)plVar33 - iVar31;
  uVar5 = pUVar8[uVar27];
  uVar6 = pUVar9[uVar29];
  pUVar9[uVar29] = UVar34;
  pUVar8[uVar27] = UVar34;
  plVar22 = (long *)((long)plVar33 + 1);
  if ((uVar35 == 0) || (*(int *)((long)plVar33 + -uVar21 + 1) != *(int *)((long)plVar33 + 1))) {
    if ((uVar14 < uVar5) && (plVar24 = (long *)(pBVar7 + uVar5), *plVar24 == lVar17)) {
      sVar16 = ZSTD_count((BYTE *)(plVar33 + 1),(BYTE *)(plVar24 + 1),(BYTE *)pInLimit);
      lVar17 = sVar16 + 8;
      uVar21 = (long)plVar33 - (long)plVar24;
      for (plVar22 = plVar33;
          ((plVar1 < plVar24 && (src < plVar22)) &&
          (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
          plVar22 = (long *)((long)plVar22 + -1)) {
        plVar24 = (long *)((long)plVar24 + -1);
        lVar17 = lVar17 + 1;
      }
      goto LAB_0010ea49;
    }
    if ((uVar14 < uVar6) && (plVar24 = (long *)(pBVar7 + uVar6), (int)*plVar24 == (int)*plVar33))
    goto LAB_0010e973;
    plVar33 = (long *)((long)plVar33 + ((long)plVar33 - (long)src >> 8) + 1);
    goto LAB_0010e74a;
  }
  sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 5),(BYTE *)((long)plVar33 + -uVar21 + 5),
                      (BYTE *)pInLimit);
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00110571;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
  uVar27 = (long)plVar22 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27)) goto LAB_00110590;
  if (pInLimit < plVar22) goto LAB_001105af;
  if (plVar15 < plVar22) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
    goto LAB_0010e88f;
  }
  lVar17 = *(long *)((long)src + 8);
  *plVar33 = *src;
  plVar33[1] = lVar17;
  pBVar10 = seqStore->lit;
  if (uVar27 < 0x11) {
    seqStore->lit = pBVar10 + uVar27;
    goto LAB_0010eb66;
  }
  lVar17 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
  if (lVar17 < 8) {
    if (-0x10 < lVar17) goto LAB_0011060c;
  }
  else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0011062b;
  lVar17 = *(long *)((long)src + 0x18);
  *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
  *(long *)(pBVar10 + 0x18) = lVar17;
  if (0x20 < (long)uVar27) {
    lVar17 = 0;
    do {
      puVar3 = (undefined8 *)((long)src + lVar17 + 0x20);
      uVar11 = puVar3[1];
      pBVar2 = pBVar10 + lVar17 + 0x20;
      *(undefined8 *)pBVar2 = *puVar3;
      *(undefined8 *)(pBVar2 + 8) = uVar11;
      puVar3 = (undefined8 *)((long)src + lVar17 + 0x30);
      uVar11 = puVar3[1];
      *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
      *(undefined8 *)(pBVar2 + 0x18) = uVar11;
      lVar17 = lVar17 + 0x20;
    } while (pBVar2 + 0x20 < pBVar10 + uVar27);
  }
LAB_0010e88f:
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthID != 0) goto LAB_001105ed;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010eb66:
  lVar17 = sVar16 + 4;
  uVar29 = sVar16 + 1;
  psVar26 = seqStore->sequences;
  psVar26->litLength = (U16)uVar27;
  psVar26->offset = 1;
  if (uVar29 < 0x10000) goto LAB_0010ebe9;
  if (seqStore->longLengthID == 0) goto LAB_0010ebca;
LAB_001105ce:
  __assert_fail("seqStorePtr->longLengthID == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2058,
                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)")
  ;
LAB_0010f877:
  lVar17 = *plVar22;
  uVar21 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
  uVar5 = pUVar8[uVar21];
  pUVar8[uVar21] = UVar34 + 1;
  if ((uVar14 < uVar5) && (plVar25 = (long *)(pBVar7 + uVar5), *plVar25 == lVar17)) {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar25 + 1),(BYTE *)pInLimit);
    lVar17 = sVar16 + 8;
    uVar21 = (long)plVar22 - (long)plVar25;
    for (; ((plVar1 < plVar25 && (src < plVar22)) &&
           (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar25 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar25 = (long *)((long)plVar25 + -1);
      lVar17 = lVar17 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar24 + 4),(BYTE *)pInLimit);
    lVar17 = sVar16 + 4;
    uVar21 = (long)plVar33 - (long)plVar24;
    for (plVar22 = plVar33;
        ((plVar1 < plVar24 && (src < plVar22)) &&
        (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar24 = (long *)((long)plVar24 + -1);
      lVar17 = lVar17 + 1;
    }
  }
LAB_0010f94d:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00110571;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
  uVar27 = (long)plVar22 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27)) goto LAB_00110590;
  if (pInLimit < plVar22) goto LAB_001105af;
  if (plVar15 < plVar22) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
  }
  else {
    lVar28 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar28;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0010faa0;
    }
    lVar28 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar28 < 8) {
      if (-0x10 < lVar28) goto LAB_0011060c;
    }
    else if (0xffffffffffffffe0 < lVar28 - 0x10U) goto LAB_0011062b;
    lVar28 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar28;
    if (0x20 < (long)uVar27) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthID != 0) goto LAB_001105ed;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010faa0:
  uVar29 = lVar17 - 3;
  psVar26 = seqStore->sequences;
  psVar26->litLength = (U16)uVar27;
  psVar26->offset = (int)uVar21 + 3;
  local_b4 = uVar35;
  if (uVar29 < 0x10000) {
    uVar21 = uVar21 & 0xffffffff;
  }
  else {
    uVar21 = uVar21 & 0xffffffff;
    if (seqStore->longLengthID != 0) goto LAB_001105ce;
LAB_0010face:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010faed:
  plVar33 = (long *)(lVar17 + (long)plVar22);
  psVar26->matchLength = (U16)uVar29;
  psVar26 = psVar26 + 1;
  seqStore->sequences = psVar26;
  src = plVar33;
  if (plVar33 <= plVar32) {
    uVar35 = UVar34 + 2;
    lVar17 = *(long *)(pBVar7 + uVar35);
    pUVar8[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = uVar35;
    pUVar8[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
         ((int)plVar33 + -2) - iVar31;
    pUVar9[(ulong)(lVar17 * -0x30e4432345000000) >> (bVar19 & 0x3f)] = uVar35;
    pUVar9[(ulong)(*(long *)((long)plVar33 + -1) * -0x30e4432345000000) >> (bVar19 & 0x3f)] =
         ((int)plVar33 + -1) - iVar31;
    for (; uVar27 = (ulong)local_b4, src = plVar33, plVar33 <= plVar32;
        plVar33 = (long *)((long)plVar33 + sVar16 + 4)) {
      if ((local_b4 == 0) || ((int)*plVar33 != *(int *)((long)plVar33 - uVar27))) break;
      sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar33 + (4 - uVar27)),
                          (BYTE *)pInLimit);
      lVar17 = *plVar33;
      UVar34 = (int)plVar33 - iVar31;
      pUVar9[(ulong)(lVar17 * -0x30e4432345000000) >> (bVar19 & 0x3f)] = UVar34;
      pUVar8[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar34;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar26 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00110571;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
      plVar22 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar22) goto LAB_00110590;
      if (pInLimit < plVar33) goto LAB_001105af;
      if (plVar15 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar22,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar15);
      }
      else {
        lVar17 = plVar33[1];
        *plVar22 = *plVar33;
        plVar22[1] = lVar17;
      }
      psVar26 = seqStore->sequences;
      psVar26->litLength = 0;
      psVar26->offset = 1;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_001105ce;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar26->matchLength = (U16)(sVar16 + 1);
      psVar26 = psVar26 + 1;
      seqStore->sequences = psVar26;
      local_b4 = (uint)uVar21;
      uVar21 = uVar27;
    }
  }
  goto LAB_0010f63f;
LAB_0010f0fb:
  lVar17 = *plVar22;
  uVar21 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
  uVar5 = pUVar8[uVar21];
  pUVar8[uVar21] = UVar34 + 1;
  if ((uVar14 < uVar5) && (plVar25 = (long *)(pBVar7 + uVar5), *plVar25 == lVar17)) {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar25 + 1),(BYTE *)pInLimit);
    lVar17 = sVar16 + 8;
    uVar21 = (long)plVar22 - (long)plVar25;
    for (; ((plVar1 < plVar25 && (src < plVar22)) &&
           (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar25 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar25 = (long *)((long)plVar25 + -1);
      lVar17 = lVar17 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar24 + 4),(BYTE *)pInLimit);
    lVar17 = sVar16 + 4;
    uVar21 = (long)plVar33 - (long)plVar24;
    for (plVar22 = plVar33;
        ((plVar1 < plVar24 && (src < plVar22)) &&
        (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar24 = (long *)((long)plVar24 + -1);
      lVar17 = lVar17 + 1;
    }
  }
LAB_0010f1d1:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00110571;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
  uVar27 = (long)plVar22 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27)) goto LAB_00110590;
  if (pInLimit < plVar22) goto LAB_001105af;
  if (plVar15 < plVar22) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
  }
  else {
    lVar28 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar28;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0010f324;
    }
    lVar28 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar28 < 8) {
      if (-0x10 < lVar28) goto LAB_0011060c;
    }
    else if (0xffffffffffffffe0 < lVar28 - 0x10U) goto LAB_0011062b;
    lVar28 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar28;
    if (0x20 < (long)uVar27) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthID != 0) goto LAB_001105ed;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010f324:
  uVar29 = lVar17 - 3;
  psVar26 = seqStore->sequences;
  psVar26->litLength = (U16)uVar27;
  psVar26->offset = (int)uVar21 + 3;
  local_b4 = uVar35;
  if (uVar29 < 0x10000) {
    uVar21 = uVar21 & 0xffffffff;
  }
  else {
    uVar21 = uVar21 & 0xffffffff;
    if (seqStore->longLengthID != 0) goto LAB_001105ce;
LAB_0010f352:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010f371:
  plVar33 = (long *)(lVar17 + (long)plVar22);
  psVar26->matchLength = (U16)uVar29;
  psVar26 = psVar26 + 1;
  seqStore->sequences = psVar26;
  src = plVar33;
  if (plVar33 <= plVar32) {
    uVar35 = UVar34 + 2;
    lVar17 = *(long *)(pBVar7 + uVar35);
    pUVar8[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = uVar35;
    pUVar8[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
         ((int)plVar33 + -2) - iVar31;
    pUVar9[(ulong)(lVar17 * -0x30e4432340650000) >> (bVar19 & 0x3f)] = uVar35;
    pUVar9[(ulong)(*(long *)((long)plVar33 + -1) * -0x30e4432340650000) >> (bVar19 & 0x3f)] =
         ((int)plVar33 + -1) - iVar31;
    for (; uVar27 = (ulong)local_b4, src = plVar33, plVar33 <= plVar32;
        plVar33 = (long *)((long)plVar33 + sVar16 + 4)) {
      if ((local_b4 == 0) || ((int)*plVar33 != *(int *)((long)plVar33 - uVar27))) break;
      sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar33 + (4 - uVar27)),
                          (BYTE *)pInLimit);
      lVar17 = *plVar33;
      UVar34 = (int)plVar33 - iVar31;
      pUVar9[(ulong)(lVar17 * -0x30e4432340650000) >> (bVar19 & 0x3f)] = UVar34;
      pUVar8[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar34;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar26 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00110571;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
      plVar22 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar22) goto LAB_00110590;
      if (pInLimit < plVar33) goto LAB_001105af;
      if (plVar15 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar22,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar15);
      }
      else {
        lVar17 = plVar33[1];
        *plVar22 = *plVar33;
        plVar22[1] = lVar17;
      }
      psVar26 = seqStore->sequences;
      psVar26->litLength = 0;
      psVar26->offset = 1;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_001105ce;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar26->matchLength = (U16)(sVar16 + 1);
      psVar26 = psVar26 + 1;
      seqStore->sequences = psVar26;
      local_b4 = (uint)uVar21;
      uVar21 = uVar27;
    }
  }
  goto LAB_0010eecc;
LAB_0010ffd9:
  lVar17 = *plVar22;
  uVar21 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
  uVar5 = pUVar8[uVar21];
  pUVar8[uVar21] = UVar34 + 1;
  if ((uVar14 < uVar5) && (plVar25 = (long *)(pBVar7 + uVar5), *plVar25 == lVar17)) {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar25 + 1),(BYTE *)pInLimit);
    lVar17 = sVar16 + 8;
    uVar21 = (long)plVar22 - (long)plVar25;
    for (; ((plVar1 < plVar25 && (src < plVar22)) &&
           (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar25 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar25 = (long *)((long)plVar25 + -1);
      lVar17 = lVar17 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar24 + 4),(BYTE *)pInLimit);
    lVar17 = sVar16 + 4;
    uVar21 = (long)plVar33 - (long)plVar24;
    for (plVar22 = plVar33;
        ((plVar1 < plVar24 && (src < plVar22)) &&
        (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar24 = (long *)((long)plVar24 + -1);
      lVar17 = lVar17 + 1;
    }
  }
LAB_001100b2:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00110571;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
  uVar27 = (long)plVar22 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27)) goto LAB_00110590;
  if (pInLimit < plVar22) goto LAB_001105af;
  if (plVar15 < plVar22) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
  }
  else {
    lVar28 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar28;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_00110208;
    }
    lVar28 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar28 < 8) {
      if (-0x10 < lVar28) goto LAB_0011060c;
    }
    else if (0xffffffffffffffe0 < lVar28 - 0x10U) goto LAB_0011062b;
    lVar28 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar28;
    if (0x20 < (long)uVar27) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthID != 0) goto LAB_001105ed;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00110208:
  uVar29 = lVar17 - 3;
  psVar26 = seqStore->sequences;
  psVar26->litLength = (U16)uVar27;
  psVar26->offset = (int)uVar21 + 3;
  local_b4 = uVar35;
  if (uVar29 < 0x10000) {
    uVar21 = uVar21 & 0xffffffff;
  }
  else {
    uVar21 = uVar21 & 0xffffffff;
    if (seqStore->longLengthID != 0) goto LAB_001105ce;
LAB_00110235:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00110254:
  plVar33 = (long *)(lVar17 + (long)plVar22);
  psVar26->matchLength = (U16)uVar29;
  psVar26 = psVar26 + 1;
  seqStore->sequences = psVar26;
  src = plVar33;
  if (plVar33 <= plVar32) {
    uVar35 = UVar34 + 2;
    pUVar8[(ulong)(*(long *)(pBVar7 + uVar35) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = uVar35;
    pUVar8[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
         ((int)plVar33 + -2) - iVar31;
    pUVar9[(uint)(*(int *)(pBVar7 + uVar35) * -0x61c8864f) >> (bVar19 & 0x1f)] = uVar35;
    pUVar9[(uint)(*(int *)((long)plVar33 + -1) * -0x61c8864f) >> (bVar19 & 0x1f)] =
         ((int)plVar33 + -1) - iVar31;
    for (; uVar27 = (ulong)local_b4, src = plVar33, plVar33 <= plVar32;
        plVar33 = (long *)((long)plVar33 + sVar16 + 4)) {
      lVar17 = *plVar33;
      if ((local_b4 == 0) || ((int)lVar17 != *(int *)((long)plVar33 - uVar27))) break;
      sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar33 + (4 - uVar27)),
                          (BYTE *)pInLimit);
      UVar34 = (int)plVar33 - iVar31;
      pUVar9[(uint)((int)lVar17 * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar34;
      pUVar8[(ulong)(*plVar33 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar34;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar26 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00110571;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
      plVar22 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar22) goto LAB_00110590;
      if (pInLimit < plVar33) goto LAB_001105af;
      if (plVar15 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar22,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar15);
      }
      else {
        lVar17 = plVar33[1];
        *plVar22 = *plVar33;
        plVar22[1] = lVar17;
      }
      psVar26 = seqStore->sequences;
      psVar26->litLength = 0;
      psVar26->offset = 1;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_001105ce;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar26->matchLength = (U16)(sVar16 + 1);
      psVar26 = psVar26 + 1;
      seqStore->sequences = psVar26;
      local_b4 = (uint)uVar21;
      uVar21 = uVar27;
    }
  }
  goto LAB_0010fdb2;
LAB_0010e973:
  lVar17 = *plVar22;
  uVar21 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
  uVar5 = pUVar8[uVar21];
  pUVar8[uVar21] = UVar34 + 1;
  if ((uVar14 < uVar5) && (plVar25 = (long *)(pBVar7 + uVar5), *plVar25 == lVar17)) {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 9),(BYTE *)(plVar25 + 1),(BYTE *)pInLimit);
    lVar17 = sVar16 + 8;
    uVar21 = (long)plVar22 - (long)plVar25;
    for (; ((plVar1 < plVar25 && (src < plVar22)) &&
           (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar25 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar25 = (long *)((long)plVar25 + -1);
      lVar17 = lVar17 + 1;
    }
  }
  else {
    sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar24 + 4),(BYTE *)pInLimit);
    lVar17 = sVar16 + 4;
    uVar21 = (long)plVar33 - (long)plVar24;
    for (plVar22 = plVar33;
        ((plVar1 < plVar24 && (src < plVar22)) &&
        (*(BYTE *)((long)plVar22 + -1) == *(BYTE *)((long)plVar24 + -1)));
        plVar22 = (long *)((long)plVar22 + -1)) {
      plVar24 = (long *)((long)plVar24 + -1);
      lVar17 = lVar17 + 1;
    }
  }
LAB_0010ea49:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00110571:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00110552:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar27 = (long)plVar22 - (long)src;
  plVar33 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar33 + uVar27)) {
LAB_00110590:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < plVar22) {
LAB_001105af:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar15 < plVar22) {
    ZSTD_safecopyLiterals((BYTE *)plVar33,(BYTE *)src,(BYTE *)plVar22,(BYTE *)plVar15);
  }
  else {
    lVar28 = *(long *)((long)src + 8);
    *plVar33 = *src;
    plVar33[1] = lVar28;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0010eb9c;
    }
    lVar28 = (long)(pBVar10 + 0x10) - ((long)src + 0x10);
    if (lVar28 < 8) {
      if (-0x10 < lVar28) {
LAB_0011060c:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar28 - 0x10U) {
LAB_0011062b:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar28 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar28;
    if (0x20 < (long)uVar27) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar11 = puVar3[1];
        pBVar2 = pBVar10 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar11;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar11 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar11;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthID != 0) {
LAB_001105ed:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010eb9c:
  uVar29 = lVar17 - 3;
  psVar26 = seqStore->sequences;
  psVar26->litLength = (U16)uVar27;
  psVar26->offset = (int)uVar21 + 3;
  local_b4 = uVar35;
  if (uVar29 < 0x10000) {
    uVar21 = uVar21 & 0xffffffff;
  }
  else {
    uVar21 = uVar21 & 0xffffffff;
    if (seqStore->longLengthID != 0) goto LAB_001105ce;
LAB_0010ebca:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0010ebe9:
  plVar33 = (long *)(lVar17 + (long)plVar22);
  psVar26->matchLength = (U16)uVar29;
  psVar26 = psVar26 + 1;
  seqStore->sequences = psVar26;
  src = plVar33;
  if (plVar33 <= plVar32) {
    uVar35 = UVar34 + 2;
    lVar17 = *(long *)(pBVar7 + uVar35);
    pUVar8[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = uVar35;
    pUVar8[(ulong)(*(long *)((long)plVar33 + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
         ((int)plVar33 + -2) - iVar31;
    pUVar9[(ulong)(lVar17 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = uVar35;
    pUVar9[(ulong)(*(long *)((long)plVar33 + -1) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] =
         ((int)plVar33 + -1) - iVar31;
    for (; uVar27 = (ulong)local_b4, src = plVar33, plVar33 <= plVar32;
        plVar33 = (long *)((long)plVar33 + sVar16 + 4)) {
      if ((local_b4 == 0) || ((int)*plVar33 != *(int *)((long)plVar33 - uVar27))) break;
      sVar16 = ZSTD_count((BYTE *)((long)plVar33 + 4),(BYTE *)((long)plVar33 + (4 - uVar27)),
                          (BYTE *)pInLimit);
      lVar17 = *plVar33;
      UVar34 = (int)plVar33 - iVar31;
      pUVar9[(ulong)(lVar17 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = UVar34;
      pUVar8[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar34;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar26 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00110571;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00110552;
      plVar22 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar22) goto LAB_00110590;
      if (pInLimit < plVar33) goto LAB_001105af;
      if (plVar15 < plVar33) {
        ZSTD_safecopyLiterals((BYTE *)plVar22,(BYTE *)plVar33,(BYTE *)plVar33,(BYTE *)plVar15);
      }
      else {
        lVar17 = plVar33[1];
        *plVar22 = *plVar33;
        plVar22[1] = lVar17;
      }
      psVar26 = seqStore->sequences;
      psVar26->litLength = 0;
      psVar26->offset = 1;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_001105ce;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar26 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar26->matchLength = (U16)(sVar16 + 1);
      psVar26 = psVar26 + 1;
      seqStore->sequences = psVar26;
      local_b4 = (uint)uVar21;
      uVar21 = uVar27;
    }
  }
  goto LAB_0010e744;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}